

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall Default::Action(Default *this)

{
  SymbolName SVar1;
  int iVar2;
  Statement *pSVar3;
  compile_errcode cVar4;
  
  iVar2 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar2 == 0) {
      iVar2 = 1;
      if (SVar1 != DEFAULT_SYM) {
        return -1;
      }
    }
    else {
      if (iVar2 != 1) {
        pSVar3 = (Statement *)operator_new(0x1e8);
        Statement::Statement(pSVar3);
        this->m_statement_ptr = pSVar3;
        iVar2 = (*(pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface[2])(pSVar3);
        pSVar3 = this->m_statement_ptr;
        if (iVar2 == 0) {
          (*(pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar3);
          pSVar3 = this->m_statement_ptr;
          cVar4 = 0;
        }
        else {
          cVar4 = -1;
        }
        if (pSVar3 != (Statement *)0x0) {
          Statement::~Statement(pSVar3);
        }
        operator_delete(pSVar3);
        return cVar4;
      }
      iVar2 = 2;
      if (SVar1 != COLON_SYM) {
        return -1;
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}